

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokth.c
# Opt level: O3

int tokthsea1(void *ctx0,toksdef *sym,mcmon objn)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  
  bVar1 = sym->tokslen;
  iVar3 = 0;
  if (bVar1 == *(byte *)((long)ctx0 + 0xe)) {
    iVar2 = bcmp(sym->toksnam,*ctx0,(ulong)bVar1);
    iVar3 = 0;
    if (iVar2 == 0) {
      memcpy(*(void **)((long)ctx0 + 0x38),sym,(ulong)bVar1 + 8);
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

static int tokthsea1(void *ctx0, toksdef *sym, mcmon objn)
{
    tokseadef *ctx = (tokseadef *)ctx0;
    
    VARUSED(objn);
    
    if (sym->tokslen == ctx->tokseasym.tokslen &&
        !memcmp(sym->toksnam, ctx->tokseanam, ctx->tokseasym.tokslen))
    {
        memcpy(ctx->toksearet, sym,
               (size_t)(sizeof(toks1def) + ctx->tokseasym.tokslen));
        return(TRUE);
    }
    else
        return(FALSE);
}